

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O0

bool __thiscall
QFileSystemIterator::advance
          (QFileSystemIterator *this,QFileSystemEntry *fileEntry,QFileSystemMetaData *metaData)

{
  QByteArrayView ba;
  QStringView name_00;
  bool bVar1;
  int *piVar2;
  pointer __dirp;
  dirent64 *pdVar3;
  anon_class_8_1_8991fb9c *this_00;
  QStringView *this_01;
  storage_type *in_RDI;
  long in_FS_OFFSET;
  char16_t *end;
  QByteArrayView name;
  anon_class_8_1_8991fb9c asFileEntry;
  QVarLengthArray<char16_t,_256LL> buffer;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffd00;
  QFileSystemMetaData *in_stack_fffffffffffffd08;
  char16_t *in_stack_fffffffffffffd20;
  storage_type *psVar4;
  undefined7 in_stack_fffffffffffffd58;
  byte in_stack_fffffffffffffd5f;
  undefined1 local_290 [32];
  QByteArrayView local_270 [5];
  undefined1 local_220 [512];
  QVLABase<char16_t> QStack_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser> *)0x17d065);
  if (bVar1) {
    do {
      piVar2 = __errno_location();
      *piVar2 = 0;
      __dirp = std::unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser>::get
                         ((unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser> *)0x17d08e)
      ;
      pdVar3 = readdir64((DIR *)__dirp);
      *(dirent64 **)(in_RDI + 0x20) = pdVar3;
      if (*(long *)(in_RDI + 0x20) == 0) {
        piVar2 = __errno_location();
        *(int *)(in_RDI + 0x28) = *piVar2;
        in_stack_fffffffffffffd5f = 0;
        break;
      }
      local_270[0].m_size = -0x5555555555555556;
      local_270[0].m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      this_01 = (QStringView *)(*(long *)(in_RDI + 0x20) + 0x13);
      strlen((char *)(*(long *)(in_RDI + 0x20) + 0x13));
      QByteArrayView::QByteArrayView<char,_true>
                ((QByteArrayView *)this_01,(char *)in_stack_fffffffffffffd08,
                 (qsizetype)in_stack_fffffffffffffd00);
      memset(local_220,0xaa,0x218);
      QByteArrayView::size(local_270);
      QVarLengthArray<char16_t,_256LL>::QVarLengthArray
                (in_stack_fffffffffffffd00,
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      this_00 = (anon_class_8_1_8991fb9c *)(in_RDI + 0x30);
      QVLABase<char16_t>::data(&QStack_20);
      local_290._16_8_ = local_270[0].m_size;
      local_290._24_8_ = local_270[0].m_data;
      ba.m_data = in_RDI;
      ba.m_size = (qsizetype)in_stack_fffffffffffffd20;
      in_stack_fffffffffffffd20 =
           QStringDecoder::appendToBuffer
                     ((QStringDecoder *)in_stack_fffffffffffffd08,
                      (char16_t *)in_stack_fffffffffffffd00,ba);
      QVarLengthArray<char16_t,_256LL>::constData((QVarLengthArray<char16_t,_256LL> *)0x17d1ae);
      QVarLengthArray<char16_t,_256LL>::resize
                (in_stack_fffffffffffffd00,
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      bVar1 = QStringConverter::hasError((QStringConverter *)(in_RDI + 0x30));
      if (bVar1) {
        piVar2 = __errno_location();
        *piVar2 = 0x54;
      }
      else {
        in_stack_fffffffffffffd00 = (QVarLengthArray<char16_t,_256LL> *)local_290;
        in_stack_fffffffffffffd08 =
             (QFileSystemMetaData *)
             std::data<QVarLengthArray<char16_t,256ll>>
                       ((QVarLengthArray<char16_t,_256LL> *)0x17d207);
        QtPrivate::lengthHelperContainer<QVarLengthArray<char16_t,256ll>>
                  ((QVarLengthArray<char16_t,_256LL> *)0x17d216);
        QStringView::QStringView<char16_t,_true>
                  (this_01,(char16_t *)in_stack_fffffffffffffd08,
                   (qsizetype)in_stack_fffffffffffffd00);
        name_00.m_size._0_7_ = in_stack_fffffffffffffd58;
        name_00.m_data = (storage_type_conflict *)psVar4;
        name_00.m_size._7_1_ = in_stack_fffffffffffffd5f;
        advance::anon_class_8_1_8991fb9c::operator()(this_00,name_00);
        QFileSystemEntry::operator=
                  ((QFileSystemEntry *)in_stack_fffffffffffffd00,
                   (QFileSystemEntry *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)
                  );
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd00);
        QFileSystemMetaData::fillFromDirEnt
                  (in_stack_fffffffffffffd08,(dirent64 *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd5f = 1;
      }
      QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd00);
    } while (bVar1);
  }
  else {
    in_stack_fffffffffffffd5f = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_fffffffffffffd5f & 1);
}

Assistant:

bool QFileSystemIterator::advance(QFileSystemEntry &fileEntry, QFileSystemMetaData &metaData)
{
    auto asFileEntry = [this](QStringView name) {
#ifdef Q_OS_DARWIN
        // must match QFile::decodeName
        QString normalized = name.toString().normalized(QString::NormalizationForm_C);
        name = normalized;
#endif
        return QFileSystemEntry(dirPath + name, QFileSystemEntry::FromInternalPath());
    };
    if (!dir)
        return false;

    for (;;) {
        // From readdir man page:
        // If the end of the directory stream is reached, NULL is returned and errno is
        // not changed. If an error occurs, NULL is returned and errno is set to indicate
        // the error. To distinguish end of stream from an error, set errno to zero before
        // calling readdir() and then check the value of errno if NULL is returned.
        errno = 0;
        dirEntry = QT_READDIR(dir.get());

        if (dirEntry) {
            // POSIX allows readdir() to return a file name in struct dirent that
            // extends past the end of the d_name array (it's a char[1] array on QNX, for
            // example). Therefore, we *must* call strlen() on it to get the actual length
            // of the file name. See:
            // https://pubs.opengroup.org/onlinepubs/9699919799/basedefs/dirent.h.html#tag_13_07_05
            QByteArrayView name(dirEntry->d_name, strlen(dirEntry->d_name));
            // name.size() is sufficient here, see QUtf8::convertToUnicode() for details
            QVarLengthArray<char16_t> buffer(name.size());
            auto *end = toUtf16.appendToBuffer(buffer.data(), name);
            buffer.resize(end - buffer.constData());
            if (!toUtf16.hasError()) {
                fileEntry = asFileEntry(buffer);
                metaData.fillFromDirEnt(*dirEntry);
                return true;
            } else {
                errno = EILSEQ; // Invalid or incomplete multibyte or wide character
            }
        } else {
            break;
        }
    }

    lastError = errno;
    return false;
}